

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O2

void __thiscall
duckdb::BatchedBufferedData::UpdateMinBatchIndex(BatchedBufferedData *this,idx_t min_batch_index)

{
  mutex *__mutex;
  lock_guard<std::mutex> *lock;
  
  __mutex = &(this->super_BufferedData).glock;
  lock = (lock_guard<std::mutex> *)min_batch_index;
  ::std::mutex::lock(__mutex);
  if (this->min_batch < min_batch_index) {
    this->min_batch = min_batch_index;
    MoveCompletedBatches(this,lock);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void BatchedBufferedData::UpdateMinBatchIndex(idx_t min_batch_index) {
	lock_guard<mutex> lock(glock);

	auto old_min_batch = min_batch;
	auto new_min_batch = MaxValue(old_min_batch, min_batch_index);
	if (new_min_batch == min_batch) {
		// No change, early out
		return;
	}
	min_batch = new_min_batch;
	MoveCompletedBatches(lock);
}